

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

uint8_t hf_hex2bin(uint8_t c,bool *err)

{
  byte bVar1;
  
  bVar1 = c - 0x30;
  if (9 < bVar1) {
    if ((byte)(c + 0x9f) < 6) {
      bVar1 = c + 0xa9;
    }
    else {
      if (5 < (byte)(c + 0xbf)) {
        *err = true;
        return '\0';
      }
      bVar1 = c - 0x37;
    }
  }
  return bVar1;
}

Assistant:

static inline uint8_t hf_hex2bin(uint8_t c, bool &err)
{
    if (c >= '0' && c <= '9') {
        return c - '0';
    }
    else if (c >= 'a' && c <= 'f') {
        return c - 'a' + 0xA;
    }
    else if (c >= 'A' && c <= 'F') {
        return c - 'A' + 0xA;
    }

    err = true;
    return 0;
}